

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

string * __thiscall
llvm::ErrorInfoBase::message_abi_cxx11_(string *__return_storage_ptr__,ErrorInfoBase *this)

{
  string *psVar1;
  undefined1 local_60 [8];
  raw_string_ostream OS;
  string Msg;
  
  OS.OS = (string *)&Msg._M_string_length;
  Msg._M_dataplus._M_p = (pointer)0x0;
  Msg._M_string_length._0_1_ = 0;
  OS.super_raw_ostream.OutBufCur._0_4_ = 1;
  OS.super_raw_ostream.OutBufEnd = (char *)0x0;
  OS.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
  OS.super_raw_ostream.OutBufStart = (char *)0x0;
  local_60 = (undefined1  [8])&PTR__raw_string_ostream_01129208;
  OS.super_raw_ostream._32_8_ = &OS.OS;
  (*this->_vptr_ErrorInfoBase[2])(this);
  psVar1 = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_60);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_60);
  std::__cxx11::string::~string((string *)&OS.OS);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string message() const {
    std::string Msg;
    raw_string_ostream OS(Msg);
    log(OS);
    return OS.str();
  }